

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::printFunction(VirtualMachine *this,Function *fn)

{
  ostream *poVar1;
  const_reference pvVar2;
  size_t i;
  ulong uVar3;
  ByteCode bc;
  string local_58;
  vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_> *local_38;
  
  poVar1 = std::operator<<(this->out,"| | Argument Count: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(this->out,"| | Local Count: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  std::operator<<(this->out,"| | Capture Contexts:\n");
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(fn->closures).
                            super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(fn->closures).
                            super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar3 = uVar3 + 1) {
    poVar1 = std::operator<<(this->out,"| |   |");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"| ClosureContext(scopeOffsets:");
    std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::at
              (&fn->closures,uVar3);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,", LocalIndex: ");
    std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::at
              (&fn->closures,uVar3);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,")");
    std::operator<<(poVar1,'\n');
  }
  std::operator<<(this->out,"| | Byte Code:\n");
  local_38 = &fn->byteCode;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(fn->byteCode).
                            super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(fn->byteCode).
                            super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar3 = uVar3 + 1) {
    poVar1 = std::operator<<(this->out,"| |   |");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"| ");
    pvVar2 = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::at
                       (local_38,uVar3);
    bc._4_4_ = 0;
    bc.instruction = pvVar2->instruction;
    bc.parameter = pvVar2->parameter;
    byteCodeToString_abi_cxx11_(&local_58,this,bc,false);
    poVar1 = std::operator<<(poVar1,(string *)&local_58);
    std::operator<<(poVar1,'\n');
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::operator<<(this->out,"| \\------------------\n");
  return;
}

Assistant:

void runtime::VirtualMachine::printFunction(const bytecode::Function* fn) {
  this->out << "| | Argument Count: " << fn->argumentCount << '\n';
  this->out << "| | Local Count: " << fn->localsCount << '\n';
  this->out << "| | Capture Contexts:\n";
  for (std::size_t i = 0; i < fn->closures.size(); i++) {
    this->out << "| |   |" << i << "| ClosureContext(scopeOffsets:" << fn->closures.at(i).scopeOffsets << ", LocalIndex: " << fn->closures.at(i).localIndex << ")" << '\n';
  }
  this->out << "| | Byte Code:\n";
  for (std::size_t i = 0; i < fn->byteCode.size(); i++) {
    this->out << "| |   |" << i << "| " << this->byteCodeToString(fn->byteCode.at(i), false) << '\n';
  }
  this->out << "| \\------------------\n";
}